

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O3

void on_get_device_twin_completed
               (DEVICE_TWIN_UPDATE_STATE update_state,uchar *payLoad,size_t size,
               void *userContextCallback)

{
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  
  if (userContextCallback != (void *)0x0) {
    (**userContextCallback)();
    free(userContextCallback);
    return;
  }
  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
  if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
               ,"on_get_device_twin_completed",0x4e0,1,"Invalid argument (userContextCallback=NULL)"
              );
    return;
  }
  return;
}

Assistant:

static void on_get_device_twin_completed(DEVICE_TWIN_UPDATE_STATE update_state, const unsigned char* payLoad, size_t size, void* userContextCallback)
{
    if (userContextCallback == NULL)
    {
        LogError("Invalid argument (userContextCallback=NULL)");
    }
    else
    {
        GET_TWIN_CONTEXT* getTwinCtx = (GET_TWIN_CONTEXT*)userContextCallback;
        getTwinCtx->callback(update_state, payLoad, size, getTwinCtx->context);
        free(getTwinCtx);
    }
}